

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O1

void __thiscall KryoFlux::UploadFirmware(KryoFlux *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  exception *this_00;
  posix_error *this_01;
  int *piVar7;
  size_type *psVar8;
  int iVar9;
  ulong uVar10;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fwpath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fwdata;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fwverify;
  ifstream fwfile;
  string local_2c8;
  string local_2a8;
  string local_288;
  void *local_268;
  void *local_260;
  long local_258;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  string local_238;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  paVar3 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"T#","");
  paVar1 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,">","");
  SamBaCommand(this,&local_238,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"N#","");
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"\n\r","");
  SamBaCommand(this,&local_238,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  util::resource_dir_abi_cxx11_();
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2c8.field_2._M_allocated_capacity = *psVar8;
    local_2c8.field_2._8_8_ = plVar6[3];
    local_2c8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *psVar8;
    local_2c8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2c8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream(&local_238,(string *)&local_2c8,_S_bin);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    this_01 = (posix_error *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    posix_error::posix_error(this_01,*piVar7,local_2c8._M_dataplus._M_p);
    __cxa_throw(this_01,&posix_error::typeinfo,std::system_error::~system_error);
  }
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf =
       *(streambuf_type **)((long)auStack_150 + *(long *)(local_238._M_dataplus._M_p + -0x18));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_268,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&local_2a8);
  uVar10 = (long)local_260 - (long)local_268;
  iVar5 = (int)uVar10;
  util::fmt_abi_cxx11_(&local_2a8,"S%08lx,%08lx#",0x202000,uVar10 & 0xffffffff);
  paVar3 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
  SamBaCommand(this,&local_2a8,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar3) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (0 < iVar5) {
    iVar9 = 0;
    do {
      iVar4 = (**(code **)(*(long *)this + 0x28))(this,(long)local_268 + (long)iVar9,iVar5 - iVar9);
      iVar9 = iVar9 + iVar4;
    } while (iVar9 < iVar5);
  }
  util::fmt_abi_cxx11_(&local_2a8,"R%08lx,%08lx#",0x202000,uVar10 & 0xffffffff);
  local_288._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
  SamBaCommand(this,&local_2a8,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar3) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_250,(long)iVar5,(allocator_type *)&local_2a8);
  if (0 < iVar5) {
    iVar9 = 0;
    do {
      iVar4 = (**(code **)(*(long *)this + 0x20))
                        (this,local_250.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + iVar9,iVar5 - iVar9);
      iVar9 = iVar9 + iVar4;
    } while (iVar9 < iVar5);
  }
  if ((long)local_260 - (long)local_268 ==
      (long)local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_260 != local_268) {
      iVar5 = bcmp(local_268,
                   local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(long)local_260 - (long)local_268);
      if (iVar5 != 0) goto LAB_001626d6;
    }
    util::fmt_abi_cxx11_(&local_2a8,"G%08lx#",0x202000);
    local_288._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
    SamBaCommand(this,&local_2a8,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar3) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if (local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_268 != (void *)0x0) {
      operator_delete(local_268,local_258 - (long)local_268);
    }
    std::ifstream::~ifstream(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
LAB_001626d6:
  this_00 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[29]>
            (this_00,(char (*) [29])"firmware verification failed");
  __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void KryoFlux::UploadFirmware()
{
    // Set interactive then non-interactive mode, to check for boot responses
    // https://sourceforge.net/p/lejos/wiki-nxt/SAM-BA%20Protocol/
    SamBaCommand("T#", ">");
    SamBaCommand("N#", "\n\r");

    auto fwpath = util::resource_dir() + KF_FW_FILE;
    std::ifstream fwfile(fwpath, std::ios::binary);
    if (!fwfile)
        throw posix_error(errno, fwpath.c_str());

    auto fwdata = std::vector<uint8_t>(std::istreambuf_iterator<char>(fwfile),
        std::istreambuf_iterator<char>());
    auto fwsize = static_cast<int>(fwdata.size());

    SamBaCommand(util::fmt("S%08lx,%08lx#", KF_FW_LOAD_ADDR, fwsize));

    auto offset = 0;
    while (offset < fwsize)
        offset += Write(fwdata.data() + offset, fwsize - offset);

    SamBaCommand(util::fmt("R%08lx,%08lx#", KF_FW_LOAD_ADDR, fwsize));

    std::vector<uint8_t> fwverify(fwsize);
    for (offset = 0; offset < fwsize; )
        offset += Read(fwverify.data() + offset, fwsize - offset);

    if (fwdata != fwverify)
        throw util::exception("firmware verification failed");

    SamBaCommand(util::fmt("G%08lx#", KF_FW_EXEC_ADDR));
}